

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

RecyclableObject *
Js::JavascriptOperators::IteratorNext
          (RecyclableObject *iterator,ScriptContext *scriptContext,RecyclableObject *nextFunc,
          Var value)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this;
  bool bVar2;
  Attributes attributes;
  BOOL BVar3;
  JavascriptMethod p_Var4;
  RecyclableObject *pRVar5;
  Arguments local_60;
  ScriptContext *local_50;
  RecyclableObject *local_48;
  Var args [2];
  
  this = scriptContext->threadContext;
  args[1]._7_1_ = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  local_50 = scriptContext;
  attributes = FunctionInfo::GetAttributes(nextFunc);
  bVar2 = ThreadContext::HasNoSideEffect(this,nextFunc,attributes);
  if (bVar2) {
    local_48 = iterator;
    args[0] = value;
    p_Var4 = RecyclableObject::GetEntryPoint(nextFunc);
    local_60.Info = (Type)(0x2000002 - (ulong)(value == (Var)0x0));
    local_60.Values = &local_48;
    pRVar5 = (RecyclableObject *)
             JavascriptFunction::CallFunction<true>(nextFunc,p_Var4,&local_60,false);
    bVar2 = ThreadContext::IsOnStack(pRVar5);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      pRVar5 = (((((((((nextFunc->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
      goto LAB_00ace66d;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this->implicitCallFlags;
      local_48 = iterator;
      args[0] = value;
      p_Var4 = RecyclableObject::GetEntryPoint(nextFunc);
      local_60.Info = (Type)(0x2000002 - (ulong)(value == (Var)0x0));
      local_60.Values = &local_48;
      pRVar5 = (RecyclableObject *)
               JavascriptFunction::CallFunction<true>(nextFunc,p_Var4,&local_60,false);
      this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00ace66d;
    }
    local_48 = iterator;
    args[0] = value;
    p_Var4 = RecyclableObject::GetEntryPoint(nextFunc);
    local_60.Info = (Type)(0x2000002 - (ulong)(value == (Var)0x0));
    local_60.Values = &local_48;
    pRVar5 = (RecyclableObject *)
             JavascriptFunction::CallFunction<true>(nextFunc,p_Var4,&local_60,false);
    bVar2 = ThreadContext::IsOnStack(pRVar5);
  }
  if (bVar2 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00ace66d:
  this->reentrancySafeOrHandled = (bool)args[1]._7_1_;
  BVar3 = IsObject(pRVar5);
  if (BVar3 == 0) {
    bVar2 = ThreadContext::RecordImplicitException(this);
    if (bVar2) {
      JavascriptError::ThrowTypeError(local_50,-0x7ff5ec71,(PCWSTR)0x0);
    }
    pRVar5 = (((local_50->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
  }
  else {
    pRVar5 = VarTo<Js::RecyclableObject>(pRVar5);
  }
  return pRVar5;
}

Assistant:

RecyclableObject* JavascriptOperators::IteratorNext(RecyclableObject* iterator, ScriptContext* scriptContext, RecyclableObject* nextFunc, Var value)
    {
        ThreadContext *threadContext = scriptContext->GetThreadContext();

        Var result = threadContext->ExecuteImplicitCall(nextFunc, ImplicitCall_Accessor, [=]() -> Var
            {
                Js::Var args[] = { iterator, value };
                Js::CallInfo callInfo(Js::CallFlags_Value, _countof(args) + (value == nullptr ? -1 : 0));
                return JavascriptFunction::CallFunction<true>(nextFunc, nextFunc->GetEntryPoint(), Arguments(callInfo, args));
            });

        if (!JavascriptOperators::IsObject(result))
        {
            if (!threadContext->RecordImplicitException())
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
        }

        return VarTo<RecyclableObject>(result);
    }